

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralContactClipping.cpp
# Opt level: O1

bool cbtPolyhedralContactClipping::findSeparatingAxis
               (cbtConvexPolyhedron *hullA,cbtConvexPolyhedron *hullB,cbtTransform *transA,
               cbtTransform *transB,cbtVector3 *sep,Result *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  uint uVar3;
  uint uVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtFace *pcVar7;
  cbtVector3 *pcVar8;
  cbtVector3 cVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  cbtScalar cVar15;
  bool bVar16;
  bool bVar17;
  char cVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 extraout_var [60];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  float fVar34;
  float fVar35;
  float fVar36;
  float local_1cc;
  cbtVector3 faceANormalWS;
  cbtScalar d;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  cbtVector3 DeltaC2;
  uint local_170;
  uint local_16c;
  cbtVector3 wA;
  float local_138;
  float local_128;
  cbtVector3 wB;
  float local_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  float local_c8;
  undefined4 uStack_c4;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  float local_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined8 uStack_80;
  float local_48;
  
  gActualSATPairTests = gActualSATPairTests + 1;
  cVar1 = (hullA->m_localCenter).m_floats[0];
  fVar28 = (hullA->m_localCenter).m_floats[1];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transA->m_basis).m_el[0].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]));
  cVar2 = (hullA->m_localCenter).m_floats[2];
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar2),
                            ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transA->m_basis).m_el[1].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)cVar2),
                            ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transA->m_basis).m_el[2].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar2),
                            ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]));
  cVar1 = (hullB->m_localCenter).m_floats[0];
  fVar28 = (hullB->m_localCenter).m_floats[1];
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transB->m_basis).m_el[0].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]));
  cVar2 = (hullB->m_localCenter).m_floats[2];
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar2),
                            ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transB->m_basis).m_el[1].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)cVar2),
                            ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]));
  auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transB->m_basis).m_el[2].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]));
  auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)cVar2),
                            ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]));
  auVar26 = vinsertps_avx(ZEXT416((uint)((auVar26._0_4_ + (transA->m_origin).m_floats[0]) -
                                        (auVar13._0_4_ + (transB->m_origin).m_floats[0]))),
                          ZEXT416((uint)((auVar11._0_4_ + (transA->m_origin).m_floats[1]) -
                                        (auVar14._0_4_ + (transB->m_origin).m_floats[1]))),0x10);
  DeltaC2.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar26,ZEXT416((uint)((auVar12._0_4_ + (transA->m_origin).m_floats[2]) -
                                           (auVar29._0_4_ + (transB->m_origin).m_floats[2]))),0x28);
  uVar20 = (ulong)(hullA->m_faces).m_size;
  bVar25 = 0 < (long)uVar20;
  if ((long)uVar20 < 1) {
    local_1cc = 3.4028235e+38;
  }
  else {
    cVar1 = DeltaC2.m_floats[0];
    cVar2 = DeltaC2.m_floats[1];
    cVar15 = DeltaC2.m_floats[2];
    local_1cc = 3.4028235e+38;
    lVar22 = 0x28;
    uVar23 = 1;
    do {
      pcVar7 = (hullA->m_faces).m_data;
      uVar3 = *(uint *)((long)pcVar7->m_plane + lVar22 + -0x28);
      fVar28 = *(float *)((long)pcVar7->m_plane + lVar22 + -0x24);
      uVar4 = *(uint *)((long)pcVar7->m_plane + lVar22 + -0x20);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transA->m_basis).m_el[0].m_floats[1])),
                                ZEXT416(uVar3),ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]))
      ;
      auVar26 = vfmadd231ss_fma(auVar26,ZEXT416(uVar4),
                                ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]));
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transA->m_basis).m_el[1].m_floats[1])),
                                ZEXT416(uVar3),ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]))
      ;
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416(uVar4),
                                ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]));
      auVar26 = vinsertps_avx(auVar26,auVar11,0x10);
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transA->m_basis).m_el[2].m_floats[1])),
                                ZEXT416(uVar3),ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]))
      ;
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416(uVar4),
                                ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]));
      cVar9.m_floats = (cbtScalar  [4])vinsertps_avx(auVar26,auVar11,0x28);
      faceANormalWS.m_floats[0] = cVar9.m_floats[0];
      faceANormalWS.m_floats[1] = cVar9.m_floats[1];
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(faceANormalWS.m_floats[1] * cVar2)),
                                ZEXT416((uint)faceANormalWS.m_floats[0]),ZEXT416((uint)cVar1));
      faceANormalWS.m_floats[2] = cVar9.m_floats[2];
      auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)faceANormalWS.m_floats[2]),
                                ZEXT416((uint)cVar15));
      if (auVar26._0_4_ < 0.0) {
        faceANormalWS.m_floats._0_8_ = cVar9.m_floats._0_8_ ^ 0x8000000080000000;
        faceANormalWS.m_floats[3] = cVar9.m_floats[3];
        faceANormalWS.m_floats[2] = -faceANormalWS.m_floats[2];
        cVar9.m_floats = faceANormalWS.m_floats;
      }
      faceANormalWS.m_floats = cVar9.m_floats;
      gExpectedNbTests = gExpectedNbTests + 1;
      if (gUseInternalObject == true) {
        bVar16 = TestInternalObjects(transA,transB,&DeltaC2,&faceANormalWS,hullA,hullB,local_1cc);
        bVar17 = false;
        if (bVar16) goto LAB_00910fcc;
      }
      else {
LAB_00910fcc:
        gActualNbTests = gActualNbTests + 1;
        bVar16 = TestSepAxis(hullA,hullB,transA,transB,&faceANormalWS,&d,&wA,&wB);
        bVar17 = true;
        if ((bVar16) && (bVar17 = false, d < local_1cc)) {
          *(undefined8 *)sep->m_floats = faceANormalWS.m_floats._0_8_;
          *(undefined8 *)(sep->m_floats + 2) = faceANormalWS.m_floats._8_8_;
          local_1cc = d;
        }
      }
      if (bVar17) break;
      bVar25 = uVar23 < uVar20;
      lVar22 = lVar22 + 0x30;
      lVar21 = (1 - uVar20) + uVar23;
      uVar23 = uVar23 + 1;
    } while (lVar21 != 1);
  }
  if (!bVar25) {
    uVar20 = (ulong)(hullB->m_faces).m_size;
    bVar25 = 0 < (long)uVar20;
    if (0 < (long)uVar20) {
      cVar1 = DeltaC2.m_floats[0];
      cVar2 = DeltaC2.m_floats[1];
      cVar15 = DeltaC2.m_floats[2];
      lVar22 = 0x28;
      uVar23 = 1;
      do {
        pcVar7 = (hullB->m_faces).m_data;
        uVar3 = *(uint *)((long)pcVar7->m_plane + lVar22 + -0x28);
        fVar28 = *(float *)((long)pcVar7->m_plane + lVar22 + -0x24);
        uVar4 = *(uint *)((long)pcVar7->m_plane + lVar22 + -0x20);
        auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transB->m_basis).m_el[0].m_floats[1])),
                                  ZEXT416(uVar3),
                                  ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]));
        auVar26 = vfmadd231ss_fma(auVar26,ZEXT416(uVar4),
                                  ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]));
        auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transB->m_basis).m_el[1].m_floats[1])),
                                  ZEXT416(uVar3),
                                  ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]));
        auVar11 = vfmadd231ss_fma(auVar11,ZEXT416(uVar4),
                                  ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]));
        auVar26 = vinsertps_avx(auVar26,auVar11,0x10);
        auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transB->m_basis).m_el[2].m_floats[1])),
                                  ZEXT416(uVar3),
                                  ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]));
        auVar11 = vfmadd231ss_fma(auVar11,ZEXT416(uVar4),
                                  ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]));
        cVar9.m_floats = (cbtScalar  [4])vinsertps_avx(auVar26,auVar11,0x28);
        faceANormalWS.m_floats[0] = cVar9.m_floats[0];
        faceANormalWS.m_floats[1] = cVar9.m_floats[1];
        auVar26 = vfmadd231ss_fma(ZEXT416((uint)(faceANormalWS.m_floats[1] * cVar2)),
                                  ZEXT416((uint)faceANormalWS.m_floats[0]),ZEXT416((uint)cVar1));
        faceANormalWS.m_floats[2] = cVar9.m_floats[2];
        auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)faceANormalWS.m_floats[2]),
                                  ZEXT416((uint)cVar15));
        if (auVar26._0_4_ < 0.0) {
          faceANormalWS.m_floats._0_8_ = cVar9.m_floats._0_8_ ^ 0x8000000080000000;
          faceANormalWS.m_floats[3] = cVar9.m_floats[3];
          faceANormalWS.m_floats[2] = -faceANormalWS.m_floats[2];
          cVar9.m_floats = faceANormalWS.m_floats;
        }
        faceANormalWS.m_floats = cVar9.m_floats;
        gExpectedNbTests = gExpectedNbTests + 1;
        if (gUseInternalObject == true) {
          bVar17 = TestInternalObjects(transA,transB,&DeltaC2,&faceANormalWS,hullA,hullB,local_1cc);
          iVar19 = 7;
          if (bVar17) goto LAB_009111e5;
        }
        else {
LAB_009111e5:
          gActualNbTests = gActualNbTests + 1;
          bVar17 = TestSepAxis(hullA,hullB,transA,transB,&faceANormalWS,&d,&wA,&wB);
          iVar19 = 1;
          if ((bVar17) && (iVar19 = 0, d < local_1cc)) {
            *(undefined8 *)sep->m_floats = faceANormalWS.m_floats._0_8_;
            *(undefined8 *)(sep->m_floats + 2) = faceANormalWS.m_floats._8_8_;
            local_1cc = d;
          }
        }
        if ((iVar19 != 7) && (iVar19 != 0)) break;
        bVar25 = uVar23 < uVar20;
        lVar22 = lVar22 + 0x30;
        lVar21 = (1 - uVar20) + uVar23;
        uVar23 = uVar23 + 1;
      } while (lVar21 != 1);
    }
    if (!bVar25) {
      iVar19 = (hullA->m_uniqueEdges).m_size;
      bVar25 = iVar19 < 1;
      if (iVar19 < 1) {
        bVar17 = false;
        local_1a0 = 0.0;
        local_1a8 = 0.0;
        local_1a4 = 0.0;
        local_19c = 0.0;
        local_198 = 0.0;
        local_194 = 0.0;
      }
      else {
        cVar1 = DeltaC2.m_floats[0];
        cVar2 = DeltaC2.m_floats[1];
        local_16c = 0xffffffff;
        cVar15 = DeltaC2.m_floats[2];
        lVar22 = 0;
        auVar33 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_170 = 0xffffffff;
        local_194 = 0.0;
        local_198 = 0.0;
        local_19c = 0.0;
        local_1a4 = 0.0;
        local_1a8 = 0.0;
        local_1a0 = 0.0;
        do {
          cVar18 = '\v';
          if (0 < (hullB->m_uniqueEdges).m_size) {
            pcVar8 = (hullA->m_uniqueEdges).m_data;
            cVar5 = pcVar8[lVar22].m_floats[0];
            fVar28 = pcVar8[lVar22].m_floats[1];
            cVar6 = pcVar8[lVar22].m_floats[2];
            auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transA->m_basis).m_el[0].m_floats[1])
                                             ),ZEXT416((uint)cVar5),
                                      ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]));
            auVar11 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar6),
                                      ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]));
            auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transA->m_basis).m_el[1].m_floats[1])
                                             ),ZEXT416((uint)cVar5),
                                      ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]));
            auVar12 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar6),
                                      ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]));
            auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (transA->m_basis).m_el[2].m_floats[1])
                                             ),ZEXT416((uint)cVar5),
                                      ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]));
            auVar13 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar6),
                                      ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]));
            auVar26 = vinsertps_avx(auVar11,auVar12,0x10);
            fVar28 = auVar13._0_4_;
            local_128 = -fVar28;
            local_138 = -auVar11._0_4_;
            local_48 = -auVar12._0_4_;
            lVar24 = 8;
            lVar21 = 0;
            do {
              pcVar8 = (hullB->m_uniqueEdges).m_data;
              uVar3 = *(uint *)((long)pcVar8->m_floats + lVar24 + -8);
              fVar27 = *(float *)((long)pcVar8->m_floats + lVar24 + -4);
              uVar4 = *(uint *)((long)pcVar8->m_floats + lVar24);
              auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (transB->m_basis).m_el[0].m_floats
                                                                [1])),ZEXT416(uVar3),
                                        ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]));
              auVar14 = vfmadd231ss_fma(auVar13,ZEXT416(uVar4),
                                        ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]));
              auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (transB->m_basis).m_el[1].m_floats
                                                                [1])),ZEXT416(uVar3),
                                        ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]));
              auVar29 = vfmadd231ss_fma(auVar13,ZEXT416(uVar4),
                                        ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]));
              auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (transB->m_basis).m_el[2].m_floats
                                                                [1])),ZEXT416(uVar3),
                                        ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]));
              auVar30 = vfmadd231ss_fma(auVar13,ZEXT416(uVar4),
                                        ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]));
              auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ * local_128)),auVar30,
                                        ZEXT416((uint)auVar12._0_4_));
              auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * local_138)),auVar14,
                                        ZEXT416((uint)fVar28));
              auVar13 = vinsertps_avx(auVar13,auVar32,0x10);
              auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * local_48)),auVar29,
                                        ZEXT416((uint)auVar11._0_4_));
              faceANormalWS.m_floats = (cbtScalar  [4])vinsertps_avx(auVar13,auVar32,0x28);
              auVar32 = auVar33._0_16_;
              auVar13 = vandps_avx(ZEXT416((uint)faceANormalWS.m_floats[0]),auVar32);
              if ((1e-06 < auVar13._0_4_) ||
                 (auVar13 = vandps_avx(ZEXT416((uint)faceANormalWS.m_floats[1]),auVar32),
                 1e-06 < auVar13._0_4_)) {
LAB_009114f9:
                auVar13 = vfmadd213ss_fma(ZEXT416((uint)faceANormalWS.m_floats[0]),
                                          ZEXT416((uint)faceANormalWS.m_floats[0]),
                                          ZEXT416((uint)(faceANormalWS.m_floats[1] *
                                                        faceANormalWS.m_floats[1])));
                auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)faceANormalWS.m_floats[2]),
                                          ZEXT416((uint)faceANormalWS.m_floats[2]));
                if (auVar13._0_4_ < 0.0) {
                  fVar27 = sqrtf(auVar13._0_4_);
                }
                else {
                  auVar13 = vsqrtss_avx(auVar13,auVar13);
                  fVar27 = auVar13._0_4_;
                }
                cVar9.m_floats = faceANormalWS.m_floats;
                fVar27 = 1.0 / fVar27;
                fVar10 = fVar27 * faceANormalWS.m_floats[0];
                faceANormalWS.m_floats[1] = fVar27 * faceANormalWS.m_floats[1];
                faceANormalWS.m_floats[0] = fVar10;
                faceANormalWS.m_floats[2] = cVar9.m_floats[2];
                faceANormalWS.m_floats[2] = fVar27 * faceANormalWS.m_floats[2];
                faceANormalWS.m_floats[3] = cVar9.m_floats[3];
                auVar13 = vfmadd231ss_fma(ZEXT416((uint)(faceANormalWS.m_floats[1] * cVar2)),
                                          ZEXT416((uint)fVar10),ZEXT416((uint)cVar1));
                auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)faceANormalWS.m_floats[2]),
                                          ZEXT416((uint)cVar15));
                if (auVar13._0_4_ < 0.0) {
                  faceANormalWS.m_floats[1] = -faceANormalWS.m_floats[1];
                  faceANormalWS.m_floats[0] = -fVar10;
                  faceANormalWS.m_floats[2] = -faceANormalWS.m_floats[2];
                }
                faceANormalWS.m_floats[0] = (cbtScalar)faceANormalWS.m_floats[0];
                faceANormalWS.m_floats[1] = (cbtScalar)faceANormalWS.m_floats[1];
                faceANormalWS.m_floats[2] = (cbtScalar)faceANormalWS.m_floats[2];
                gExpectedNbTests = gExpectedNbTests + 1;
                if (gUseInternalObject == true) {
                  bVar17 = TestInternalObjects(transA,transB,&DeltaC2,&faceANormalWS,hullA,hullB,
                                               local_1cc);
                  cVar18 = '\r';
                  if (!bVar17) {
                    auVar33 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                      );
                    goto LAB_0091176e;
                  }
                }
                gActualNbTests = gActualNbTests + 1;
                bVar17 = TestSepAxis(hullA,hullB,transA,transB,&faceANormalWS,&d,&wA,&wB);
                if (bVar17) {
                  auVar33 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                  if (d < local_1cc) {
                    local_b8 = vinsertps_avx(auVar14,ZEXT416((uint)auVar29._0_4_),0x10);
                    uStack_a4 = 0;
                    uStack_a0 = 0;
                    *(undefined8 *)sep->m_floats = faceANormalWS.m_floats._0_8_;
                    *(undefined8 *)(sep->m_floats + 2) = faceANormalWS.m_floats._8_8_;
                    local_19c = wA.m_floats[0];
                    local_198 = wA.m_floats[1];
                    local_194 = wA.m_floats[2];
                    local_1a0 = wB.m_floats[0];
                    local_1a8 = wB.m_floats[1];
                    local_1a4 = wB.m_floats[2];
                    uStack_80 = auVar26._8_8_;
                    local_d8 = auVar26._0_4_;
                    uStack_d4 = auVar26._4_4_;
                    uStack_d0 = uStack_80;
                    uStack_c4 = 0;
                    uStack_c0 = 0;
                    local_170 = (uint)lVar21;
                    local_16c = (uint)lVar22;
                    local_1cc = d;
                    local_c8 = fVar28;
                    local_a8 = auVar30._0_4_;
                  }
                }
                else {
                  auVar33 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                }
                cVar18 = !bVar17;
              }
              else {
                auVar13 = vandps_avx(ZEXT416((uint)faceANormalWS.m_floats[2]),auVar32);
                cVar18 = '\0';
                if (1e-06 < auVar13._0_4_) goto LAB_009114f9;
              }
LAB_0091176e:
              if ((cVar18 != '\r') && (cVar18 != '\0')) goto LAB_0091179e;
              lVar21 = lVar21 + 1;
              lVar24 = lVar24 + 0x10;
            } while (lVar21 < (hullB->m_uniqueEdges).m_size);
            cVar18 = '\v';
          }
LAB_0091179e:
          if ((cVar18 != '\v') && (cVar18 != '\0')) break;
          lVar22 = lVar22 + 1;
          lVar21 = (long)(hullA->m_uniqueEdges).m_size;
          bVar25 = lVar21 <= lVar22;
        } while (lVar22 < lVar21);
        bVar17 = -1 < (int)(local_16c | local_170);
      }
      if (bVar25 == false) {
        return false;
      }
      if (bVar17) {
        fVar28 = local_1a0 - local_19c;
        fVar27 = local_1a8 - local_198;
        fVar10 = local_1a4 - local_194;
        auVar12._4_4_ = uStack_d4;
        auVar12._0_4_ = local_d8;
        auVar12._8_8_ = uStack_d0;
        auVar26 = vmovshdup_avx(auVar12);
        auVar11 = vmovshdup_avx(local_b8);
        fVar31 = auVar11._0_4_;
        fVar34 = auVar26._0_4_;
        auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar34)),auVar12,local_b8);
        auVar14._4_4_ = uStack_a4;
        auVar14._0_4_ = local_a8;
        auVar14._8_8_ = uStack_a0;
        auVar13._4_4_ = uStack_c4;
        auVar13._0_4_ = local_c8;
        auVar13._8_8_ = uStack_c0;
        auVar26 = vfmadd231ss_fma(auVar26,auVar13,auVar14);
        auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar34)),auVar12,ZEXT416((uint)fVar28));
        auVar11 = vfmadd231ss_fma(auVar11,auVar13,ZEXT416((uint)fVar10));
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar31)),local_b8,ZEXT416((uint)fVar28));
        auVar12 = vfmadd231ss_fma(auVar12,auVar14,ZEXT416((uint)fVar10));
        auVar13 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar26,auVar26);
        auVar33 = ZEXT864(0) << 0x20;
        fVar36 = auVar13._0_4_;
        if ((fVar36 != 0.0) || (NAN(fVar36))) {
          auVar13 = vfnmadd213ss_fma(auVar26,auVar12,auVar11);
          fVar36 = auVar13._0_4_ / fVar36;
          auVar33 = ZEXT464(0xf149f2ca);
          if ((-1e+30 <= fVar36) &&
             (auVar33 = ZEXT1664(CONCAT124(auVar13._4_12_,fVar36)), 1e+30 < fVar36)) {
            auVar33 = ZEXT464(0x7149f2ca);
          }
        }
        auVar12 = vfmsub231ss_fma(auVar12,auVar33._0_16_,auVar26);
        fVar36 = auVar12._0_4_;
        if (-1e+30 <= fVar36) {
          if (1e+30 < fVar36) {
            fVar36 = 1e+30;
            auVar26 = vfmadd213ss_fma(auVar26,SUB6416(ZEXT464(0x7149f2ca),0),auVar11);
            auVar33 = ZEXT1664(SUB6416(ZEXT464(0xf149f2ca),0));
            if (-1e+30 <= auVar26._0_4_) {
              fVar36 = 1e+30;
              auVar33 = ZEXT1664(auVar26);
              if (1e+30 < auVar26._0_4_) {
                auVar33 = ZEXT464(0x7149f2ca);
                fVar36 = 1e+30;
              }
            }
          }
        }
        else {
          fVar36 = -1e+30;
          auVar26 = vfmadd213ss_fma(auVar26,SUB6416(ZEXT464(0xf149f2ca),0),auVar11);
          if (-1e+30 <= auVar26._0_4_) {
            if (auVar26._0_4_ <= 1e+30) {
              auVar33 = ZEXT1664(auVar26);
            }
            else {
              auVar33 = ZEXT464(0x7149f2ca);
            }
          }
          else {
            auVar33 = ZEXT1664(SUB6416(ZEXT464(0xf149f2ca),0));
          }
        }
        fVar35 = auVar33._0_4_;
        auVar26 = vinsertps_avx(ZEXT416((uint)(fVar36 * (float)local_b8._0_4_ +
                                              (fVar28 - fVar35 * local_d8))),
                                ZEXT416((uint)(fVar31 * fVar36 + (fVar27 - fVar35 * fVar34))),0x10);
        faceANormalWS.m_floats =
             (cbtScalar  [4])
             vinsertps_avx(auVar26,ZEXT416((uint)((fVar10 - fVar35 * local_c8) + fVar36 * local_a8))
                           ,0x28);
        auVar26 = vfmadd231ss_fma(ZEXT416((uint)(faceANormalWS.m_floats[1] *
                                                faceANormalWS.m_floats[1])),
                                  ZEXT416((uint)faceANormalWS.m_floats[0]),
                                  ZEXT416((uint)faceANormalWS.m_floats[0]));
        auVar26 = vfmadd213ss_fma(ZEXT416((uint)faceANormalWS.m_floats[2]),
                                  ZEXT416((uint)faceANormalWS.m_floats[2]),auVar26);
        fVar28 = auVar26._0_4_;
        if (1.1920929e-07 < fVar28) {
          if (fVar28 < 0.0) {
            auVar33._0_4_ = sqrtf(fVar28);
            auVar33._4_60_ = extraout_var;
            auVar26 = auVar33._0_16_;
          }
          else {
            auVar26 = vsqrtss_avx(auVar26,auVar26);
          }
          cVar9.m_floats = faceANormalWS.m_floats;
          fVar27 = 1.0 / auVar26._0_4_;
          fVar28 = fVar27 * faceANormalWS.m_floats[0];
          faceANormalWS.m_floats[1] = fVar27 * faceANormalWS.m_floats[1];
          faceANormalWS.m_floats[0] = fVar28;
          faceANormalWS.m_floats[2] = cVar9.m_floats[2];
          faceANormalWS.m_floats[2] = fVar27 * faceANormalWS.m_floats[2];
          faceANormalWS.m_floats[3] = cVar9.m_floats[3];
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(faceANormalWS.m_floats[1] * DeltaC2.m_floats[1]))
                                    ,ZEXT416((uint)fVar28),ZEXT416((uint)DeltaC2.m_floats[0]));
          auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)faceANormalWS.m_floats[2]),
                                    ZEXT416((uint)DeltaC2.m_floats[2]));
          if (auVar11._0_4_ < 0.0) {
            faceANormalWS.m_floats[1] = -faceANormalWS.m_floats[1];
            faceANormalWS.m_floats[0] = -fVar28;
            faceANormalWS.m_floats[2] = -faceANormalWS.m_floats[2];
          }
          faceANormalWS.m_floats[0] = (cbtScalar)faceANormalWS.m_floats[0];
          faceANormalWS.m_floats[1] = (cbtScalar)faceANormalWS.m_floats[1];
          faceANormalWS.m_floats[2] = (cbtScalar)faceANormalWS.m_floats[2];
          auVar11 = vinsertps_avx(ZEXT416((uint)(fVar36 * (float)local_b8._0_4_ + local_1a0)),
                                  ZEXT416((uint)(fVar31 * fVar36 + local_1a8)),0x10);
          wA.m_floats = (cbtScalar  [4])
                        vinsertps_avx(auVar11,ZEXT416((uint)(fVar36 * local_a8 + local_1a4)),0x28);
          auVar11._8_4_ = 0x80000000;
          auVar11._0_8_ = 0x8000000080000000;
          auVar11._12_4_ = 0x80000000;
          auVar26 = vxorps_avx512vl(auVar26,auVar11);
          (*resultOut->_vptr_Result[4])(auVar26._0_8_,resultOut,&faceANormalWS);
        }
      }
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(sep->m_floats[1] * DeltaC2.m_floats[1])),
                                ZEXT416((uint)sep->m_floats[0]),ZEXT416((uint)DeltaC2.m_floats[0]));
      auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)sep->m_floats[2]),
                                ZEXT416((uint)DeltaC2.m_floats[2]));
      if (0.0 <= auVar26._0_4_) {
        return bVar25;
      }
      auVar30._0_4_ = -sep->m_floats[2];
      auVar30._4_4_ = 0x80000000;
      auVar30._8_4_ = 0x80000000;
      auVar30._12_4_ = 0x80000000;
      auVar26 = vinsertps_avx(ZEXT416((uint)sep->m_floats[0]),ZEXT416((uint)sep->m_floats[1]),0x1c);
      auVar29._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar29._8_4_ = auVar26._8_4_ ^ 0x80000000;
      auVar29._12_4_ = auVar26._12_4_ ^ 0x80000000;
      auVar26 = vinsertps_avx(auVar29,auVar30,0x28);
      *(undefined1 (*) [16])sep->m_floats = auVar26;
      return bVar25;
    }
  }
  return false;
}

Assistant:

bool cbtPolyhedralContactClipping::findSeparatingAxis(const cbtConvexPolyhedron& hullA, const cbtConvexPolyhedron& hullB, const cbtTransform& transA, const cbtTransform& transB, cbtVector3& sep, cbtDiscreteCollisionDetectorInterface::Result& resultOut)
{
	gActualSATPairTests++;

	//#ifdef TEST_INTERNAL_OBJECTS
	const cbtVector3 c0 = transA * hullA.m_localCenter;
	const cbtVector3 c1 = transB * hullB.m_localCenter;
	const cbtVector3 DeltaC2 = c0 - c1;
	//#endif

	cbtScalar dmin = FLT_MAX;
	int curPlaneTests = 0;

	int numFacesA = hullA.m_faces.size();
	// Test normals from hullA
	for (int i = 0; i < numFacesA; i++)
	{
		const cbtVector3 Normal(hullA.m_faces[i].m_plane[0], hullA.m_faces[i].m_plane[1], hullA.m_faces[i].m_plane[2]);
		cbtVector3 faceANormalWS = transA.getBasis() * Normal;
		if (DeltaC2.dot(faceANormalWS) < 0)
			faceANormalWS *= -1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if (gUseInternalObject && !TestInternalObjects(transA, transB, DeltaC2, faceANormalWS, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		cbtScalar d;
		cbtVector3 wA, wB;
		if (!TestSepAxis(hullA, hullB, transA, transB, faceANormalWS, d, wA, wB))
			return false;

		if (d < dmin)
		{
			dmin = d;
			sep = faceANormalWS;
		}
	}

	int numFacesB = hullB.m_faces.size();
	// Test normals from hullB
	for (int i = 0; i < numFacesB; i++)
	{
		const cbtVector3 Normal(hullB.m_faces[i].m_plane[0], hullB.m_faces[i].m_plane[1], hullB.m_faces[i].m_plane[2]);
		cbtVector3 WorldNormal = transB.getBasis() * Normal;
		if (DeltaC2.dot(WorldNormal) < 0)
			WorldNormal *= -1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if (gUseInternalObject && !TestInternalObjects(transA, transB, DeltaC2, WorldNormal, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		cbtScalar d;
		cbtVector3 wA, wB;
		if (!TestSepAxis(hullA, hullB, transA, transB, WorldNormal, d, wA, wB))
			return false;

		if (d < dmin)
		{
			dmin = d;
			sep = WorldNormal;
		}
	}

	cbtVector3 edgeAstart, edgeAend, edgeBstart, edgeBend;
	int edgeA = -1;
	int edgeB = -1;
	cbtVector3 worldEdgeA;
	cbtVector3 worldEdgeB;
	cbtVector3 witnessPointA(0, 0, 0), witnessPointB(0, 0, 0);

	int curEdgeEdge = 0;
	// Test edges
	for (int e0 = 0; e0 < hullA.m_uniqueEdges.size(); e0++)
	{
		const cbtVector3 edge0 = hullA.m_uniqueEdges[e0];
		const cbtVector3 WorldEdge0 = transA.getBasis() * edge0;
		for (int e1 = 0; e1 < hullB.m_uniqueEdges.size(); e1++)
		{
			const cbtVector3 edge1 = hullB.m_uniqueEdges[e1];
			const cbtVector3 WorldEdge1 = transB.getBasis() * edge1;

			cbtVector3 Cross = WorldEdge0.cross(WorldEdge1);
			curEdgeEdge++;
			if (!IsAlmostZero(Cross))
			{
				Cross = Cross.normalize();
				if (DeltaC2.dot(Cross) < 0)
					Cross *= -1.f;

#ifdef TEST_INTERNAL_OBJECTS
				gExpectedNbTests++;
				if (gUseInternalObject && !TestInternalObjects(transA, transB, DeltaC2, Cross, hullA, hullB, dmin))
					continue;
				gActualNbTests++;
#endif

				cbtScalar dist;
				cbtVector3 wA, wB;
				if (!TestSepAxis(hullA, hullB, transA, transB, Cross, dist, wA, wB))
					return false;

				if (dist < dmin)
				{
					dmin = dist;
					sep = Cross;
					edgeA = e0;
					edgeB = e1;
					worldEdgeA = WorldEdge0;
					worldEdgeB = WorldEdge1;
					witnessPointA = wA;
					witnessPointB = wB;
				}
			}
		}
	}

	if (edgeA >= 0 && edgeB >= 0)
	{
		//		printf("edge-edge\n");
		//add an edge-edge contact

		cbtVector3 ptsVector;
		cbtVector3 offsetA;
		cbtVector3 offsetB;
		cbtScalar tA;
		cbtScalar tB;

		cbtVector3 translation = witnessPointB - witnessPointA;

		cbtVector3 dirA = worldEdgeA;
		cbtVector3 dirB = worldEdgeB;

		cbtScalar hlenB = 1e30f;
		cbtScalar hlenA = 1e30f;

		cbtSegmentsClosestPoints(ptsVector, offsetA, offsetB, tA, tB,
								translation,
								dirA, hlenA,
								dirB, hlenB);

		cbtScalar nlSqrt = ptsVector.length2();
		if (nlSqrt > SIMD_EPSILON)
		{
			cbtScalar nl = cbtSqrt(nlSqrt);
			ptsVector *= 1.f / nl;
			if (ptsVector.dot(DeltaC2) < 0.f)
			{
				ptsVector *= -1.f;
			}
			cbtVector3 ptOnB = witnessPointB + offsetB;
			cbtScalar distance = nl;
			resultOut.addContactPoint(ptsVector, ptOnB, -distance);
		}
	}

	if ((DeltaC2.dot(sep)) < 0.0f)
		sep = -sep;

	return true;
}